

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::isOutputBuiltIn(HlslParseContext *this,TQualifier *qualifier)

{
  uint uVar1;
  EShLanguage EVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&qualifier->field_0x8 >> 7 & 0x1ff;
  uVar1 = uVar3 - 0x35;
  if (uVar1 < 0x13) {
    if ((3U >> (uVar1 & 0x1f) & 1) != 0) {
      EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
      return EVar2 == EShLangVertex || EVar2 == EShLangGeometry;
    }
    if ((0x18U >> (uVar1 & 0x1f) & 1) != 0) {
      return (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl;
    }
    if ((0x44000U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_003276a7;
  }
  if (uVar3 - 0x1e < 5) {
    return (this->super_TParseContextBase).super_TParseVersions.language - EShLangRayGen <
           0xfffffffe;
  }
  if (1 < uVar3 - 0x91) {
    if (uVar3 == 0x34) {
      return (this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry;
    }
    return false;
  }
LAB_003276a7:
  return (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment;
}

Assistant:

bool HlslParseContext::isOutputBuiltIn(const TQualifier& qualifier) const
{
    switch (qualifier.builtIn) {
    case EbvPosition:
    case EbvPointSize:
    case EbvClipVertex:
    case EbvClipDistance:
    case EbvCullDistance:
        return language != EShLangFragment && language != EShLangCompute;
    case EbvFragDepth:
    case EbvFragDepthGreater:
    case EbvFragDepthLesser:
    case EbvSampleMask:
        return language == EShLangFragment;
    case EbvLayer:
    case EbvViewportIndex:
        return language == EShLangGeometry || language == EShLangVertex;
    case EbvPrimitiveId:
        return language == EShLangGeometry;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        return language == EShLangTessControl;
    default:
        return false;
    }
}